

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

void __thiscall QStyleSheetStyle::setGeometry(QStyleSheetStyle *this,QWidget *w)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  QStyleSheetGeometryData *pQVar4;
  QWidget *in_RSI;
  long in_FS_OFFSET;
  QStyleSheetGeometryData *geo;
  QRenderRule rule;
  int in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffcdc;
  int in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce4;
  undefined8 in_stack_fffffffffffffce8;
  int iVar6;
  QWidget *pQVar5;
  QWidget *in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffcfc;
  QWidget *in_stack_fffffffffffffd00;
  QStyleSheetStyle *in_stack_fffffffffffffd28;
  int local_260;
  int local_25c [3];
  QSize local_250;
  int local_248;
  int local_244 [3];
  QSize local_238;
  QSize local_228;
  quint64 in_stack_fffffffffffffde8;
  undefined1 local_210 [4];
  int in_stack_fffffffffffffdf4;
  QObject *in_stack_fffffffffffffdf8;
  QVariant local_188;
  QVariant local_168;
  QVariant local_148;
  QVariant local_128;
  QVariant local_108;
  QVariant local_e8;
  QVariant local_c8;
  QVariant local_a8;
  QVariant local_88;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  iVar6 = (int)((ulong)in_stack_fffffffffffffce8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_210,0xaa,0x88);
  extendedPseudoClass(in_stack_fffffffffffffd00);
  renderRule(in_stack_fffffffffffffd28,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
             in_stack_fffffffffffffde8);
  pQVar4 = QRenderRule::geometry((QRenderRule *)0x429073);
  QObject::property((char *)&local_28);
  uVar3 = ::QVariant::toBool();
  bVar2 = false;
  if ((uVar3 & 1) != 0) {
    bVar1 = QRenderRule::hasGeometry
                      ((QRenderRule *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0))
    ;
    bVar2 = true;
    if (bVar1) {
      bVar2 = pQVar4->minWidth == -1;
    }
  }
  ::QVariant::~QVariant(&local_28);
  if (bVar2) {
    QWidget::setMinimumWidth(in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc);
    ::QVariant::QVariant((QVariant *)0x42914d);
    QObject::setProperty
              ((QObject *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
               (char *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
               (QVariant *)0x429169);
    ::QVariant::~QVariant(&local_48);
  }
  QObject::property((char *)&local_68);
  uVar3 = ::QVariant::toBool();
  bVar2 = false;
  if ((uVar3 & 1) != 0) {
    bVar1 = QRenderRule::hasGeometry
                      ((QRenderRule *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0))
    ;
    bVar2 = true;
    if (bVar1) {
      bVar2 = pQVar4->minHeight == -1;
    }
  }
  ::QVariant::~QVariant(&local_68);
  if (bVar2) {
    QWidget::setMinimumHeight(in_stack_fffffffffffffcf0,iVar6);
    ::QVariant::QVariant((QVariant *)0x429245);
    QObject::setProperty
              ((QObject *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
               (char *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
               (QVariant *)0x42925e);
    ::QVariant::~QVariant(&local_88);
  }
  QObject::property((char *)&local_a8);
  uVar3 = ::QVariant::toBool();
  bVar2 = false;
  if ((uVar3 & 1) != 0) {
    bVar1 = QRenderRule::hasGeometry
                      ((QRenderRule *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0))
    ;
    bVar2 = true;
    if (bVar1) {
      bVar2 = pQVar4->maxWidth == -1;
    }
  }
  ::QVariant::~QVariant(&local_a8);
  if (bVar2) {
    QWidget::setMaximumWidth(in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc);
    ::QVariant::QVariant((QVariant *)0x429325);
    QObject::setProperty
              ((QObject *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
               (char *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
               (QVariant *)0x42933e);
    ::QVariant::~QVariant(&local_c8);
  }
  QObject::property((char *)&local_e8);
  uVar3 = ::QVariant::toBool();
  bVar2 = false;
  if ((uVar3 & 1) != 0) {
    bVar1 = QRenderRule::hasGeometry
                      ((QRenderRule *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0))
    ;
    bVar2 = true;
    if (bVar1) {
      bVar2 = pQVar4->maxHeight == -1;
    }
  }
  ::QVariant::~QVariant(&local_e8);
  if (bVar2) {
    QWidget::setMaximumHeight(in_stack_fffffffffffffcf0,iVar6);
    ::QVariant::QVariant((QVariant *)0x429405);
    QObject::setProperty
              ((QObject *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
               (char *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
               (QVariant *)0x42941e);
    ::QVariant::~QVariant(&local_108);
  }
  bVar2 = QRenderRule::hasGeometry
                    ((QRenderRule *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  if (bVar2) {
    if (pQVar4->minWidth != -1) {
      ::QVariant::QVariant(&local_128,true);
      QObject::setProperty
                ((QObject *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                 (char *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                 (QVariant *)0x42948b);
      ::QVariant::~QVariant(&local_128);
      qMax<int>(&pQVar4->width,&pQVar4->minWidth);
      QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                   in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8);
      QRenderRule::boxSize
                ((QRenderRule *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                 (QSize *)in_stack_fffffffffffffcf0,iVar6);
      QSize::width((QSize *)0x429502);
      QWidget::setMinimumWidth(in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc);
    }
    if (pQVar4->minHeight != -1) {
      ::QVariant::QVariant(&local_148,true);
      QObject::setProperty
                ((QObject *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                 (char *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                 (QVariant *)0x429558);
      ::QVariant::~QVariant(&local_148);
      qMax<int>(&pQVar4->height,&pQVar4->minHeight);
      QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                   in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8);
      local_228 = QRenderRule::boxSize
                            ((QRenderRule *)
                             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                             (QSize *)in_stack_fffffffffffffcf0,iVar6);
      QSize::height((QSize *)0x4295cf);
      QWidget::setMinimumHeight(in_stack_fffffffffffffcf0,iVar6);
    }
    if (pQVar4->maxWidth != -1) {
      pQVar5 = in_RSI;
      ::QVariant::QVariant(&local_168,true);
      QObject::setProperty
                ((QObject *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                 (char *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                 (QVariant *)0x429625);
      ::QVariant::~QVariant(&local_168);
      if (pQVar4->width == -1) {
        in_stack_fffffffffffffcfc = 0xffffff;
      }
      else {
        in_stack_fffffffffffffcfc = pQVar4->width;
      }
      if (pQVar4->maxWidth == -1) {
        in_stack_fffffffffffffcf8 = 0xffffff;
      }
      else {
        in_stack_fffffffffffffcf8 = pQVar4->maxWidth;
      }
      local_248 = in_stack_fffffffffffffcf8;
      local_244[0] = in_stack_fffffffffffffcfc;
      qMin<int>(local_244,&local_248);
      QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                   in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8);
      local_238 = QRenderRule::boxSize
                            ((QRenderRule *)
                             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                             (QSize *)in_stack_fffffffffffffcf0,iVar6);
      QSize::width((QSize *)0x4296fa);
      QWidget::setMaximumWidth(pQVar5,in_stack_fffffffffffffcfc);
    }
    if (pQVar4->maxHeight != -1) {
      pQVar5 = in_RSI;
      ::QVariant::QVariant(&local_188,true);
      iVar6 = (int)((ulong)pQVar5 >> 0x20);
      QObject::setProperty
                ((QObject *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                 (char *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                 (QVariant *)0x429750);
      ::QVariant::~QVariant(&local_188);
      if (pQVar4->height == -1) {
        in_stack_fffffffffffffce4 = 0xffffff;
      }
      else {
        in_stack_fffffffffffffce4 = pQVar4->height;
      }
      if (pQVar4->maxHeight == -1) {
        in_stack_fffffffffffffce0 = 0xffffff;
      }
      else {
        in_stack_fffffffffffffce0 = pQVar4->maxHeight;
      }
      local_260 = in_stack_fffffffffffffce0;
      local_25c[0] = in_stack_fffffffffffffce4;
      qMin<int>(local_25c,&local_260);
      QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                   in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8);
      local_250 = QRenderRule::boxSize
                            ((QRenderRule *)
                             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                             (QSize *)in_RSI,iVar6);
      QSize::height((QSize *)0x429825);
      QWidget::setMaximumHeight(in_RSI,iVar6);
    }
  }
  QRenderRule::~QRenderRule
            ((QRenderRule *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QStyleSheetStyle::setGeometry(QWidget *w)
{
    QRenderRule rule = renderRule(w, PseudoElement_None, PseudoClass_Enabled | extendedPseudoClass(w));
    const QStyleSheetGeometryData *geo = rule.geometry();
    if (w->property("_q_stylesheet_minw").toBool()
        && ((!rule.hasGeometry() || geo->minWidth == -1))) {
            w->setMinimumWidth(0);
            w->setProperty("_q_stylesheet_minw", QVariant());
    }
    if (w->property("_q_stylesheet_minh").toBool()
        && ((!rule.hasGeometry() || geo->minHeight == -1))) {
            w->setMinimumHeight(0);
            w->setProperty("_q_stylesheet_minh", QVariant());
    }
    if (w->property("_q_stylesheet_maxw").toBool()
        && ((!rule.hasGeometry() || geo->maxWidth == -1))) {
            w->setMaximumWidth(QWIDGETSIZE_MAX);
            w->setProperty("_q_stylesheet_maxw", QVariant());
    }
   if (w->property("_q_stylesheet_maxh").toBool()
        && ((!rule.hasGeometry() || geo->maxHeight == -1))) {
            w->setMaximumHeight(QWIDGETSIZE_MAX);
            w->setProperty("_q_stylesheet_maxh", QVariant());
    }


    if (rule.hasGeometry()) {
        if (geo->minWidth != -1) {
            w->setProperty("_q_stylesheet_minw", true);
            w->setMinimumWidth(rule.boxSize(QSize(qMax(geo->width, geo->minWidth), 0)).width());
        }
        if (geo->minHeight != -1) {
            w->setProperty("_q_stylesheet_minh", true);
            w->setMinimumHeight(rule.boxSize(QSize(0, qMax(geo->height, geo->minHeight))).height());
        }
        if (geo->maxWidth != -1) {
            w->setProperty("_q_stylesheet_maxw", true);
            w->setMaximumWidth(rule.boxSize(QSize(qMin(geo->width == -1 ? QWIDGETSIZE_MAX : geo->width,
                                                       geo->maxWidth == -1 ? QWIDGETSIZE_MAX : geo->maxWidth), 0)).width());
        }
        if (geo->maxHeight != -1) {
            w->setProperty("_q_stylesheet_maxh", true);
            w->setMaximumHeight(rule.boxSize(QSize(0, qMin(geo->height == -1 ? QWIDGETSIZE_MAX : geo->height,
                                                       geo->maxHeight == -1 ? QWIDGETSIZE_MAX : geo->maxHeight))).height());
        }
    }
}